

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vao.cpp
# Opt level: O1

void __thiscall graphics101::VertexAndFaceArrays::VertexAndFaceArrays(VertexAndFaceArrays *this)

{
  this->m_VAO = 0;
  this->m_num_face_indices = 0;
  (*gl3wProcs.ptr[0xb3])(1,this);
  this->m_num_face_indices = 0;
  return;
}

Assistant:

VertexAndFaceArrays::VertexAndFaceArrays()
{
    glGenVertexArrays( 1, &m_VAO );
    
    assert( sizeof( vec2 ) == 2*sizeof( GLfloat ) );
    assert( sizeof( vec3 ) == 3*sizeof( GLfloat ) );
    assert( sizeof( vec4 ) == 4*sizeof( GLfloat ) );
    assert( sizeof( ivec2 ) == 2*sizeof( GLint ) );
    assert( sizeof( ivec3 ) == 3*sizeof( GLint ) );
    assert( sizeof( ivec4 ) == 4*sizeof( GLint ) );
    
    m_num_face_indices = 0;
}